

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__interval
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  undefined8 uVar1;
  bool bVar2;
  uint *puVar3;
  StringHash SVar4;
  void *pvVar5;
  long lVar6;
  xmlChar **ppxVar7;
  xmlChar *text;
  bool failed;
  ParserChar *attributeValue;
  bool local_139;
  ParserChar *local_138;
  StackMemoryManager *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  uint *local_120;
  URI local_118;
  
  local_130 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar3 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x128);
  uVar1 = interval__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar3 = interval__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar3 + 2) = uVar1;
  uVar1 = interval__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar3 + 4) = interval__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar3 + 6) = uVar1;
  uVar1 = interval__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar3 + 8) = interval__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar3 + 10) = uVar1;
  this_00 = (URI *)(puVar3 + 0xc);
  COLLADABU::URI::URI(this_00,(URI *)(interval__AttributeData::DEFAULT + 0x30),false);
  uVar1 = interval__AttributeData::DEFAULT._288_8_;
  *(undefined8 *)(puVar3 + 0x46) = interval__AttributeData::DEFAULT._280_8_;
  *(undefined8 *)(puVar3 + 0x48) = uVar1;
  *attributeDataPtr = puVar3;
  ppxVar7 = attributes->attributes;
  if ((ppxVar7 != (xmlChar **)0x0) && (text = *ppxVar7, text != (xmlChar *)0x0)) {
    local_120 = puVar3 + 0x46;
    local_128 = (XSList<GeneratedSaxParser::ParserString> *)(puVar3 + 2);
    do {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      local_138 = ppxVar7[1];
      if ((long)SVar4 < 0x6a28a3) {
        if (SVar4 == 0x6f4) {
          *(ParserChar **)(puVar3 + 10) = local_138;
        }
        else if (SVar4 == 0x6f8b6) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
          COLLADABU::URI::operator=(this_00,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_139 == true) &&
             (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,0x6f8b6,local_138), bVar2)
             ) {
            return false;
          }
          if ((local_139 & 1U) == 0) {
            *(byte *)puVar3 = (byte)*puVar3 | 2;
          }
        }
        else if (SVar4 == 0x7f8b6) {
          *(ParserChar **)(puVar3 + 8) = local_138;
        }
        else {
LAB_0074cf9b:
          if (*(long *)local_120 == 0) {
            pvVar5 = GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x10);
          }
          else {
            pvVar5 = GeneratedSaxParser::StackMemoryManager::growObject(local_130,0x10);
          }
          *(void **)(puVar3 + 0x46) = pvVar5;
          lVar6 = *(long *)(puVar3 + 0x48);
          *(xmlChar **)((long)pvVar5 + lVar6 * 8) = text;
          *(ParserChar **)(*(long *)(puVar3 + 0x46) + 8 + lVar6 * 8) = local_138;
          *(long *)(puVar3 + 0x48) = lVar6 + 2;
        }
      }
      else if (SVar4 == 0x6a28a3) {
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,local_138,local_128);
        if (!bVar2) {
          SVar4 = 0x6a28a3;
          goto LAB_0074d045;
        }
        *(byte *)puVar3 = (byte)*puVar3 | 1;
      }
      else if (SVar4 == 0x7ac025) {
        *(ParserChar **)(puVar3 + 6) = local_138;
      }
      else {
        if (SVar4 != 0xa36ace5) goto LAB_0074cf9b;
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(local_138,(bool *)&local_118);
        lVar6 = 0;
        do {
          if (*(StringHash *)((long)&ENUM__mathml__interval__closureMap + lVar6) == SVar4) {
            puVar3[1] = *(uint *)(&UNK_008374b8 + lVar6);
            goto LAB_0074d09a;
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x40);
        local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
        puVar3[1] = 4;
        SVar4 = 0xa36ace5;
LAB_0074d045:
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,SVar4,local_138);
        if (bVar2) {
          return false;
        }
      }
LAB_0074d09a:
      ppxVar7 = ppxVar7 + 2;
      text = *ppxVar7;
    } while (text != (xmlChar *)0x0);
  }
  if ((*puVar3 & 1) == 0) {
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0;
  }
  if ((*puVar3 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__interval( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__interval( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

interval__AttributeData* attributeData = newData<interval__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CLOSURE:
    {
bool failed;
attributeData->closure = Utils::toEnum<ENUM__mathml__interval__closure, StringHash, ENUM__mathml__interval__closure__COUNT>(attributeValue, failed, ENUM__mathml__interval__closureMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLOSURE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_INTERVAL, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INTERVAL,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}